

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::GetMaxX
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  undefined4 local_2c;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_0_local;
  
  if (_stdscr == 0) {
    local_2c = -1;
  }
  else {
    local_2c = *(short *)(_stdscr + 6) + 1;
  }
  BasicValue::BasicValue(__return_storage_ptr__,local_2c);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::GetMaxX(std::list<BasicValue> &/*Args*/) {
  return getmaxx(stdscr);
}